

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::matrix4d> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::matrix4d>
          (optional<tinyusdz::value::matrix4d> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::matrix4d> local_138;
  undefined1 local_a8 [8];
  matrix4d value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value.m[3][3]._4_4_ = interp;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    tinyusdz::value::matrix4d::matrix4d((matrix4d *)local_a8);
    bVar1 = get_interpolated_value<tinyusdz::value::matrix4d>
                      (this,(matrix4d *)local_a8,t,value.m[3][3]._4_4_);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
      optional<tinyusdz::value::matrix4d,_0>(__return_storage_ptr__,(matrix4d *)local_a8);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::matrix4d>(&local_138,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::
    optional<tinyusdz::value::matrix4d,_0>(__return_storage_ptr__,&local_138);
    nonstd::optional_lite::optional<tinyusdz::value::matrix4d>::~optional(&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }